

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O3

void t42_parse_sfnts(T42_Face face,T42_Loader loader)

{
  byte bVar1;
  byte *pbVar2;
  FT_Error FVar3;
  int iVar4;
  FT_Byte *pFVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  byte *pbVar9;
  ulong uVar10;
  FT_Memory memory;
  char cVar11;
  undefined4 uVar12;
  ulong new_count;
  ulong uVar13;
  ulong uVar14;
  FT_Offset new_count_00;
  FT_Byte **ppFVar15;
  long lVar16;
  FT_Error error;
  FT_ULong real_size;
  FT_Error local_80;
  undefined4 local_7c;
  FT_Byte *local_78;
  FT_Memory local_70;
  FT_Byte **local_68;
  ulong local_60;
  ulong local_58;
  byte *local_50;
  FT_Offset local_48;
  ulong local_40;
  ulong local_38;
  
  pbVar2 = (loader->parser).root.limit;
  memory = (loader->parser).root.memory;
  ppFVar15 = &face->ttf_data;
  ft_mem_free(memory,face->ttf_data);
  face->ttf_data = (FT_Byte *)0x0;
  face->ttf_size = 0;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar9 = (loader->parser).root.cursor;
  if ((pbVar9 < pbVar2) && ((loader->parser).root.cursor = pbVar9 + 1, *pbVar9 == 0x5b)) {
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    pFVar5 = (FT_Byte *)ft_mem_qalloc(memory,0xc,&local_80);
    *ppFVar15 = pFVar5;
    if (local_80 == 0) {
      pbVar9 = (loader->parser).root.cursor;
      local_40 = 0;
      local_70 = memory;
      if (pbVar9 < pbVar2) {
        new_count = 0xc;
        lVar16 = 0;
        local_48 = 0;
        iVar4 = 0;
        local_7c = 0;
        local_78 = (FT_Byte *)0x0;
        uVar6 = 0;
        local_68 = ppFVar15;
        local_50 = pbVar2;
        do {
          memory = local_70;
          bVar1 = *pbVar9;
          if (bVar1 != 0x3c) {
            pFVar5 = local_78;
            uVar12 = local_7c;
            if (bVar1 == 0x5d) {
              (loader->parser).root.cursor = pbVar9 + 1;
              face->ttf_size = lVar16;
              iVar4 = (loader->parser).root.error;
              goto LAB_00263941;
            }
            new_count_00 = local_48;
            if (9 < bVar1 - 0x30) goto LAB_00263769;
            if ((char)local_7c == '\0') {
              local_60 = CONCAT44(local_60._4_4_,iVar4);
              uVar6 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
              if (-1 < (long)uVar6) {
                local_58 = uVar6;
                (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
                if ((loader->parser).root.error != 0) {
                  return;
                }
                pFVar5 = (loader->parser).root.cursor;
                local_78 = pFVar5 + 1;
                if (local_58 < (ulong)((long)local_50 - (long)pFVar5)) {
                  (loader->parser).root.cursor = pFVar5 + local_58 + 1;
                  local_7c = 0;
                  uVar6 = local_58;
                  new_count_00 = local_48;
                  iVar4 = (int)local_60;
                  goto LAB_0026377c;
                }
              }
LAB_00263a62:
              local_80 = 3;
              pFVar5 = local_78;
              uVar12 = 0;
            }
            else {
              local_80 = 3;
            }
            goto LAB_0026393d;
          }
          if ((char)local_7c == '\0' && local_78 != (FT_Byte *)0x0) goto LAB_00263a62;
          local_60 = CONCAT44(local_60._4_4_,iVar4);
          (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
          if ((loader->parser).root.error != 0) {
            cVar11 = (char)local_7c;
            memory = local_70;
            pFVar5 = local_78;
            goto LAB_00263945;
          }
          pFVar5 = (loader->parser).root.cursor;
          if ((ulong)((long)pFVar5 - (long)pbVar9) < 3) goto LAB_00263989;
          new_count_00 = (long)(pFVar5 + ~(ulong)pbVar9) / 2;
          pFVar5 = (FT_Byte *)ft_mem_qrealloc(local_70,1,local_48,new_count_00,local_78,&local_80);
          memory = local_70;
          ppFVar15 = local_68;
          uVar12 = local_7c;
          if (local_80 != 0) goto LAB_0026393d;
          (loader->parser).root.cursor = pbVar9;
          FVar3 = (*(loader->parser).root.funcs.to_bytes)
                            ((PS_Parser)loader,pFVar5,new_count_00,&local_38,'\x01');
          local_7c = (undefined4)CONCAT71((uint7)(uint3)((uint)FVar3 >> 8),1);
          local_78 = pFVar5;
          uVar6 = local_38;
          iVar4 = (int)local_60;
LAB_00263769:
          memory = local_70;
          if (local_78 == (FT_Byte *)0x0) {
            local_80 = 3;
            ppFVar15 = local_68;
            pFVar5 = (FT_Byte *)0x0;
            uVar12 = local_7c;
            goto LAB_0026393d;
          }
LAB_0026377c:
          local_48 = new_count_00;
          ppFVar15 = local_68;
          if ((uVar6 & 1) == 0) {
LAB_0026379c:
            if (uVar6 == 0) {
              local_80 = 3;
              pFVar5 = local_78;
              uVar12 = local_7c;
              goto LAB_0026393d;
            }
          }
          else if (local_78[uVar6 - 1] == '\0') {
            uVar6 = uVar6 - 1;
            goto LAB_0026379c;
          }
          uVar14 = (long)local_50 - (long)(loader->parser).root.cursor;
          uVar10 = 0;
          uVar13 = new_count;
          local_60 = uVar14;
          local_58 = uVar6;
          do {
            if (iVar4 == 2) {
LAB_002638de:
              iVar4 = 2;
              new_count = uVar13;
              if ((long)uVar13 <= lVar16) goto LAB_00263989;
            }
            else {
              new_count = uVar13;
              if (iVar4 == 1) {
LAB_0026383e:
                iVar4 = 1;
                ppFVar15 = local_68;
                if ((long)new_count <= lVar16) {
                  uVar13 = new_count;
                  if (0 < (int)local_40) {
                    lVar7 = 0;
                    do {
                      uVar8 = *(uint *)(*local_68 + lVar7 + 0x18);
                      uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                              uVar8 << 0x18;
                      if ((uVar14 < uVar8) || ((long)(uVar14 - uVar8) < (long)uVar13)) {
                        local_80 = 3;
                        memory = local_70;
                        pFVar5 = local_78;
                        uVar12 = local_7c;
                        goto LAB_0026393d;
                      }
                      uVar13 = uVar13 + (uVar8 + 3 & 0xfffffffc);
                      lVar7 = lVar7 + 0x10;
                    } while ((local_40 & 0xffffffff) << 4 != lVar7);
                  }
                  uVar13 = uVar13 + 1;
                  pFVar5 = (FT_Byte *)
                           ft_mem_qrealloc(local_70,1,new_count,uVar13,*local_68,&local_80);
                  *local_68 = pFVar5;
                  uVar6 = local_58;
                  memory = local_70;
                  uVar14 = local_60;
                  ppFVar15 = local_68;
                  pFVar5 = local_78;
                  uVar12 = local_7c;
                  if (local_80 == 0) goto LAB_002638de;
                  goto LAB_0026393d;
                }
              }
              else {
                iVar4 = 0;
                if (0xb < lVar16) {
                  pFVar5 = *ppFVar15;
                  uVar8 = (uint)pFVar5[5] + (uint)pFVar5[4] * 0x10;
                  local_40 = (ulong)uVar8;
                  new_count = (ulong)(uVar8 * 0x10 | 0xc);
                  if ((long)uVar14 < (long)new_count) {
                    local_80 = 3;
                    memory = local_70;
                    pFVar5 = local_78;
                    uVar12 = local_7c;
                  }
                  else {
                    pFVar5 = (FT_Byte *)
                             ft_mem_qrealloc(local_70,1,uVar13,new_count,pFVar5,&local_80);
                    *local_68 = pFVar5;
                    uVar6 = local_58;
                    memory = local_70;
                    uVar14 = local_60;
                    ppFVar15 = local_68;
                    pFVar5 = local_78;
                    uVar12 = local_7c;
                    if (local_80 == 0) goto LAB_0026383e;
                  }
                  goto LAB_0026393d;
                }
              }
            }
            (*ppFVar15)[lVar16] = local_78[uVar10];
            lVar16 = lVar16 + 1;
            uVar10 = uVar10 + 1;
            uVar13 = new_count;
          } while (uVar10 != uVar6);
          (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
          pbVar9 = (loader->parser).root.cursor;
          uVar6 = local_58;
          if (local_50 <= pbVar9) goto LAB_00263989;
        } while( true );
      }
      local_78 = (FT_Byte *)0x0;
      local_7c = 0;
LAB_00263989:
      local_80 = 3;
      memory = local_70;
      pFVar5 = local_78;
      uVar12 = local_7c;
      goto LAB_0026393d;
    }
  }
  else {
    local_80 = 3;
  }
  pFVar5 = (FT_Byte *)0x0;
  uVar12 = 0;
LAB_0026393d:
  (loader->parser).root.error = local_80;
  iVar4 = local_80;
LAB_00263941:
  cVar11 = (char)uVar12;
  if (iVar4 != 0) {
LAB_00263945:
    ft_mem_free(memory,*ppFVar15);
    *ppFVar15 = (FT_Byte *)0x0;
    ppFVar15[1] = (FT_Byte *)0x0;
  }
  if (cVar11 != '\0') {
    ft_mem_free(memory,pFVar5);
  }
  return;
}

Assistant:

static void
  t42_parse_sfnts( T42_Face    face,
                   T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Memory   memory = parser->root.memory;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;
    FT_Error    error;
    FT_Int      num_tables = 0;
    FT_Long     ttf_count;
    FT_Long     ttf_reserved;

    FT_ULong    n, string_size, old_string_size, real_size;
    FT_Byte*    string_buf = NULL;
    FT_Bool     allocated  = 0;

    T42_Load_Status  status;

    /** There should only be one sfnts array, but free any previous. */
    FT_FREE( face->ttf_data );
    face->ttf_size = 0;

    /* The format is                                */
    /*                                              */
    /*   /sfnts [ <hexstring> <hexstring> ... ] def */
    /*                                              */
    /* or                                           */
    /*                                              */
    /*   /sfnts [                                   */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      ...                                     */
    /*   ] def                                      */
    /*                                              */
    /* with exactly one space after the `RD' token. */

    T1_Skip_Spaces( parser );

    if ( parser->root.cursor >= limit || *parser->root.cursor++ != '[' )
    {
      FT_ERROR(( "t42_parse_sfnts: can't find begin of sfnts vector\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    T1_Skip_Spaces( parser );
    status          = BEFORE_START;
    string_size     = 0;
    old_string_size = 0;
    ttf_count       = 0;
    ttf_reserved    = 12;
    if ( FT_QALLOC( face->ttf_data, ttf_reserved ) )
      goto Fail;

    FT_TRACE2(( "\n" ));
    FT_TRACE2(( "t42_parse_sfnts:\n" ));

    while ( parser->root.cursor < limit )
    {
      FT_ULong  size;


      cur = parser->root.cursor;

      if ( *cur == ']' )
      {
        parser->root.cursor++;
        face->ttf_size = ttf_count;
        goto Exit;
      }

      else if ( *cur == '<' )
      {
        if ( string_buf && !allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        /* don't include delimiters */
        string_size = (FT_ULong)( ( parser->root.cursor - cur - 2 + 1 ) / 2 );
        if ( !string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        if ( FT_QREALLOC( string_buf, old_string_size, string_size ) )
          goto Fail;

        allocated = 1;

        parser->root.cursor = cur;
        (void)T1_ToBytes( parser, string_buf, string_size, &real_size, 1 );
        old_string_size = string_size;
        string_size     = real_size;
      }

      else if ( ft_isdigit( *cur ) )
      {
        FT_Long  tmp;


        if ( allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        tmp = T1_ToInt( parser );
        if ( tmp < 0 )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid string size\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          string_size = (FT_ULong)tmp;

        T1_Skip_PS_Token( parser );             /* `RD' */
        if ( parser->root.error )
          return;

        string_buf = parser->root.cursor + 1;   /* one space after `RD' */

        if ( (FT_ULong)( limit - parser->root.cursor ) <= string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          parser->root.cursor += string_size + 1;
      }

      if ( !string_buf )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* A string can have a trailing zero (odd) byte for padding. */
      /* Ignore it.                                                */
      if ( ( string_size & 1 ) && string_buf[string_size - 1] == 0 )
        string_size--;

      if ( !string_size )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid string\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      FT_TRACE2(( "  PS string size %5lu bytes, offset 0x%08lx (%lu)\n",
                  string_size, ttf_count, ttf_count ));

      /* The whole TTF is now loaded into `string_buf'.  We are */
      /* checking its contents while copying it to `ttf_data'.  */

      size = (FT_ULong)( limit - parser->root.cursor );

      for ( n = 0; n < string_size; n++ )
      {
        switch ( status )
        {
        case BEFORE_START:
          /* load offset table, 12 bytes */
          if ( ttf_count < 12 )
          {
            face->ttf_data[ttf_count++] = string_buf[n];
            continue;
          }
          else
          {
            FT_Long ttf_reserved_prev = ttf_reserved;


            num_tables   = 16 * face->ttf_data[4] + face->ttf_data[5];
            status       = BEFORE_TABLE_DIR;
            ttf_reserved = 12 + 16 * num_tables;

            FT_TRACE2(( "  SFNT directory contains %d tables\n",
                        num_tables ));

            if ( (FT_Long)size < ttf_reserved )
            {
              FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
              error = FT_THROW( Invalid_File_Format );
              goto Fail;
            }

            if ( FT_QREALLOC( face->ttf_data, ttf_reserved_prev,
                              ttf_reserved ) )
              goto Fail;
          }
          FALL_THROUGH;

        case BEFORE_TABLE_DIR:
          /* the offset table is read; read the table directory */
          if ( ttf_count < ttf_reserved )
          {
            face->ttf_data[ttf_count++] = string_buf[n];
            continue;
          }
          else
          {
            int       i;
            FT_ULong  len;
            FT_Long ttf_reserved_prev = ttf_reserved;


            FT_TRACE2(( "\n" ));
            FT_TRACE2(( "  table    length\n" ));
            FT_TRACE2(( "  ------------------------------\n" ));

            for ( i = 0; i < num_tables; i++ )
            {
              FT_Byte*  p = face->ttf_data + 12 + 16 * i + 12;


              len = FT_PEEK_ULONG( p );
              FT_TRACE2(( "   %4i  0x%08lx (%lu)\n", i, len, len ));

              if ( len > size                               ||
                   ttf_reserved > (FT_Long)( size - len ) )
              {
                FT_ERROR(( "t42_parse_sfnts:"
                           " invalid data in sfnts array\n" ));
                error = FT_THROW( Invalid_File_Format );
                goto Fail;
              }

              /* Pad to a 4-byte boundary length */
              ttf_reserved += (FT_Long)( ( len + 3 ) & ~3U );
            }
            ttf_reserved += 1;

            status = OTHER_TABLES;

            FT_TRACE2(( "\n" ));
            FT_TRACE2(( "  allocating %ld bytes\n", ttf_reserved ));
            FT_TRACE2(( "\n" ));

            if ( FT_QREALLOC( face->ttf_data, ttf_reserved_prev,
                              ttf_reserved ) )
              goto Fail;
          }
          FALL_THROUGH;

        case OTHER_TABLES:
          /* all other tables are just copied */
          if ( ttf_count >= ttf_reserved )
          {
            FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }
          face->ttf_data[ttf_count++] = string_buf[n];
        }
      }

      T1_Skip_Spaces( parser );
    }

    /* if control reaches this point, the format was not valid */
    error = FT_THROW( Invalid_File_Format );

  Fail:
    parser->root.error = error;

  Exit:
    if ( parser->root.error )
    {
      FT_FREE( face->ttf_data );
      face->ttf_size = 0;
    }
    if ( allocated )
      FT_FREE( string_buf );
  }